

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema_compile_node.c
# Opt level: O3

char * lys_status2str(uint16_t flags)

{
  char *pcVar1;
  uint uVar2;
  
  uVar2 = flags >> 2 & 7;
  if (((ushort)uVar2 < 5) && ((0x17U >> uVar2 & 1) != 0)) {
    pcVar1 = &DAT_001cdb38 + *(int *)(&DAT_001cdb38 + (ulong)uVar2 * 4);
  }
  else {
    pcVar1 = (char *)0x0;
    ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINT,"Internal error (%s:%d).",
           "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/schema_compile_node.c"
           ,0x1a0);
  }
  return pcVar1;
}

Assistant:

static const char *
lys_status2str(uint16_t flags)
{
    flags &= LYS_STATUS_MASK;

    switch (flags) {
    case 0:
    case LYS_STATUS_CURR:
        return "current";
    case LYS_STATUS_DEPRC:
        return "deprecated";
    case LYS_STATUS_OBSLT:
        return "obsolete";
    default:
        LOGINT(NULL);
        return NULL;
    }
}